

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O0

string * __thiscall aeron::Counter::label_abi_cxx11_(Counter *this)

{
  CountersReader *pCVar1;
  AtomicCounter *in_RSI;
  CountersReader *in_RDI;
  
  pCVar1 = ClientConductor::countersReader((ClientConductor *)in_RSI[1]._vptr_AtomicCounter);
  concurrent::AtomicCounter::id(in_RSI);
  concurrent::CountersReader::getCounterLabel_abi_cxx11_(in_RDI,(int32_t)((ulong)pCVar1 >> 0x20));
  return (string *)in_RDI;
}

Assistant:

std::string Counter::label() const
{
    return m_clientConductor->countersReader().getCounterLabel(id());
}